

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O3

void __thiscall cmServerResponse::cmServerResponse(cmServerResponse *this,cmServerRequest *request)

{
  pointer pcVar1;
  
  (this->Type)._M_dataplus._M_p = (pointer)&(this->Type).field_2;
  pcVar1 = (request->Type)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (request->Type)._M_string_length);
  (this->Cookie)._M_dataplus._M_p = (pointer)&(this->Cookie).field_2;
  pcVar1 = (request->Cookie)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->Cookie,pcVar1,pcVar1 + (request->Cookie)._M_string_length);
  this->m_Payload = PAYLOAD_UNKNOWN;
  (this->m_ErrorMessage)._M_dataplus._M_p = (pointer)&(this->m_ErrorMessage).field_2;
  (this->m_ErrorMessage)._M_string_length = 0;
  (this->m_ErrorMessage).field_2._M_local_buf[0] = '\0';
  Json::Value::Value(&this->m_Data,nullValue);
  return;
}

Assistant:

cmServerResponse::cmServerResponse(const cmServerRequest& request)
  : Type(request.Type)
  , Cookie(request.Cookie)
{
}